

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int fileext_n_compare(char *test_ext,char *known_ext,size_t maxlen)

{
  int iVar1;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  int cmp;
  size_t len;
  size_t c;
  char caps [8];
  size_t maxlen_local;
  char *known_ext_local;
  char *test_ext_local;
  
  caps = (char  [8])maxlen;
  memset(&c,0,8);
  test_ext_local._4_4_ = strncmp(test_ext,known_ext,(size_t)caps);
  if (((test_ext_local._4_4_ != 0) && (test_ext != (char *)0x0)) && (known_ext != (char *)0x0)) {
    _cStack_40 = (char  [8])strlen(known_ext);
    if ((ulong)caps < (ulong)_cStack_40) {
      cStack_40 = caps[0];
      cStack_3f = caps[1];
      cStack_3e = caps[2];
      cStack_3d = caps[3];
      cmp._0_1_ = caps[4];
      cmp._1_1_ = caps[5];
      cmp._2_1_ = caps[6];
      cmp._3_1_ = caps[7];
    }
    if ((ulong)_cStack_40 < 8) {
      for (len = 0; len < (ulong)_cStack_40; len = len + 1) {
        iVar1 = toupper((int)known_ext[len]);
        caps[len - 8] = (char)iVar1;
      }
      caps[len - 8] = '\0';
      test_ext_local._4_4_ = strncmp(test_ext,(char *)&c,(size_t)caps);
    }
  }
  return test_ext_local._4_4_;
}

Assistant:

static int fileext_n_compare(const char * test_ext,
                             const char * known_ext, size_t maxlen)
{
   char caps[8] = "";
   size_t c,len;
   /* if equal, don't need to check case (store to avoid multiple calls) */
   const int  cmp = strncmp(test_ext, known_ext, maxlen);
   if( cmp == 0 ) return cmp;

   /* if anything odd, use default */
   if( !test_ext || !known_ext ) return cmp;

   len = strlen(known_ext);
   if( len > maxlen ) len = maxlen;     /* ignore anything past maxlen */
   if( len > 7 ) return cmp;

   /* if here, strings are different but need to check upper-case */
   for(c = 0; c < len; c++ ) caps[c] = toupper((int) known_ext[c]);
   caps[c] = '\0';

   return strncmp(test_ext, caps, maxlen);
}